

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cpp
# Opt level: O0

void __thiscall
solitaire::graphics::Renderer::Renderer
          (Renderer *this,Context *context,
          unique_ptr<solitaire::graphics::interfaces::GraphicsSystem,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
          *graphicsSystem,string *assetsPath)

{
  pointer pGVar1;
  TextureId local_138;
  allocator<char> local_131;
  string local_130 [36];
  undefined1 local_10c [11];
  allocator<char> local_101;
  string local_100 [32];
  undefined1 local_e0 [8];
  string local_d8 [36];
  undefined1 local_b4 [11];
  allocator<char> local_a9;
  string local_a8 [32];
  undefined1 local_88 [8];
  string local_80 [32];
  undefined1 local_60 [8];
  string local_58 [32];
  undefined1 local_38 [24];
  string *assetsPath_local;
  unique_ptr<solitaire::graphics::interfaces::GraphicsSystem,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
  *graphicsSystem_local;
  Context *context_local;
  Renderer *this_local;
  
  local_38._16_8_ = assetsPath;
  assetsPath_local = (string *)graphicsSystem;
  graphicsSystem_local =
       (unique_ptr<solitaire::graphics::interfaces::GraphicsSystem,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
        *)context;
  context_local = (Context *)this;
  interfaces::Renderer::Renderer(&this->super_Renderer);
  (this->super_Renderer)._vptr_Renderer = (_func_int **)&PTR__Renderer_001507f8;
  this->context = (Context *)graphicsSystem_local;
  std::
  unique_ptr<solitaire::graphics::interfaces::GraphicsSystem,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
  ::unique_ptr(&this->graphicsSystem,graphicsSystem);
  std::__cxx11::string::string((string *)&this->assetsPath,(string *)local_38._16_8_);
  TextureId::TextureId(&this->backgroundId);
  TextureId::TextureId(&this->cardsId);
  TextureId::TextureId(&this->cardPlaceholderId);
  TextureId::TextureId(&this->winId);
  TextureId::TextureId(&this->newGameId);
  TextureId::TextureId(&this->undoId);
  pGVar1 = std::
           unique_ptr<solitaire::graphics::interfaces::GraphicsSystem,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
           ::operator->(&this->graphicsSystem);
  (*pGVar1->_vptr_GraphicsSystem[2])
            (pGVar1,(anonymous_namespace)::windowTitle_abi_cxx11_,0x280,0x1e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_58,"background.bmp",(allocator<char> *)(local_60 + 7));
  loadTexture((Renderer *)local_38,(string *)this);
  TextureId::operator=(&this->backgroundId,(TextureId *)local_38);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)(local_60 + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_80,"cards.bmp",(allocator<char> *)(local_88 + 7));
  loadTexture((Renderer *)local_60,(string *)this);
  TextureId::operator=(&this->cardsId,(TextureId *)local_60);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)(local_88 + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a8,"card_placeholder.bmp",&local_a9);
  loadTexture((Renderer *)local_88,(string *)this);
  TextureId::operator=(&this->cardPlaceholderId,(TextureId *)local_88);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator(&local_a9);
  pGVar1 = std::
           unique_ptr<solitaire::graphics::interfaces::GraphicsSystem,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
           ::operator->(&this->graphicsSystem);
  TextureId::TextureId((TextureId *)(local_b4 + 4),&this->cardPlaceholderId);
  (*pGVar1->_vptr_GraphicsSystem[4])(pGVar1,(TextureId *)(local_b4 + 4),0x46);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_d8,"win.bmp",(allocator<char> *)(local_e0 + 7));
  loadTexture((Renderer *)local_b4,(string *)this);
  TextureId::operator=(&this->winId,(TextureId *)local_b4);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)(local_e0 + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_100,"new_game.bmp",&local_101);
  loadTexture((Renderer *)local_e0,(string *)this);
  TextureId::operator=(&this->newGameId,(TextureId *)local_e0);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator(&local_101);
  pGVar1 = std::
           unique_ptr<solitaire::graphics::interfaces::GraphicsSystem,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
           ::operator->(&this->graphicsSystem);
  TextureId::TextureId((TextureId *)(local_10c + 4),&this->newGameId);
  (*pGVar1->_vptr_GraphicsSystem[4])(pGVar1,(TextureId *)(local_10c + 4),0x96);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_130,"undo.bmp",&local_131);
  loadTexture((Renderer *)local_10c,(string *)this);
  TextureId::operator=(&this->undoId,(TextureId *)local_10c);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator(&local_131);
  pGVar1 = std::
           unique_ptr<solitaire::graphics::interfaces::GraphicsSystem,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
           ::operator->(&this->graphicsSystem);
  TextureId::TextureId(&local_138,&this->undoId);
  (*pGVar1->_vptr_GraphicsSystem[4])(pGVar1,&local_138,0x96);
  return;
}

Assistant:

Renderer::Renderer(const Context& context,
                   std::unique_ptr<GraphicsSystem> graphicsSystem,
                   const std::string& assetsPath):
    context {context},
    graphicsSystem {std::move(graphicsSystem)},
    assetsPath {assetsPath}
{
    this->graphicsSystem->createWindow(windowTitle, windowWidth, windowHeight);
    backgroundId = loadTexture("background.bmp");
    cardsId = loadTexture("cards.bmp");
    cardPlaceholderId = loadTexture("card_placeholder.bmp");
    this->graphicsSystem->setTextureAlpha(cardPlaceholderId, cardPlaceholderAlpha);
    winId = loadTexture("win.bmp");
    newGameId = loadTexture("new_game.bmp");
    this->graphicsSystem->setTextureAlpha(newGameId, buttonAlpha);
    undoId = loadTexture("undo.bmp");
    this->graphicsSystem->setTextureAlpha(undoId, buttonAlpha);
}